

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall ProcessorGenerator::generate_factory(ProcessorGenerator *this)

{
  string *__lhs;
  string *psVar1;
  int *piVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  string if_factory_name;
  string sStack_d8;
  string *local_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_b8 = (string *)&this->if_name_;
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 "Factory");
  poVar4 = std::operator<<(this->f_header_,(string *)&this->template_header_);
  poVar4 = std::operator<<(poVar4,"class ");
  psVar1 = &this->factory_class_name_;
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4," : public ::apache::thrift::");
  __lhs = &this->style_;
  bVar3 = std::operator==(__lhs,"Cob");
  pcVar5 = "TProcessorFactory";
  if (bVar3) {
    pcVar5 = "async::TAsyncProcessorFactory";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&sStack_d8,this);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_d8);
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"(const ::std::shared_ptr< ");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4," >& handlerFactory) noexcept :");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_90,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"    handlerFactory_(handlerFactory) {}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_b0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_b0);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr< ::apache::thrift::");
  bVar3 = std::operator==(__lhs,"Cob");
  pcVar6 = "TProcessor";
  pcVar5 = "TProcessor";
  if (bVar3) {
    pcVar5 = "async::TAsyncProcessor";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," > ");
  poVar4 = std::operator<<(poVar4,
                           "getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) override;"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&sStack_d8);
  poVar4 = std::operator<<(this->f_header_,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," protected:");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&sStack_d8,this);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_d8);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr< ");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4," > handlerFactory_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_d8);
  piVar2 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar4 = std::operator<<(this->f_header_,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  if (this->generator_->gen_templates_ == true) {
    poVar4 = std::operator<<(this->f_header_,"typedef ");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"< ::apache::thrift::protocol::TDummyProtocol > ");
    poVar4 = std::operator<<(poVar4,(string *)&this->service_name_);
    poVar4 = std::operator<<(poVar4,(string *)&this->pstyle_);
    poVar4 = std::operator<<(poVar4,"ProcessorFactory;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  poVar4 = std::operator<<(this->f_out_,(string *)&this->template_header_);
  indent_abi_cxx11_(&sStack_d8,this);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_d8);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr< ::apache::thrift::");
  bVar3 = std::operator==(__lhs,"Cob");
  pcVar5 = "TProcessor";
  if (bVar3) {
    pcVar5 = "async::TAsyncProcessor";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," > ");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,(string *)&this->template_suffix_);
  poVar4 = std::operator<<(poVar4,"::getProcessor(");
  poVar4 = std::operator<<(poVar4,"const ::apache::thrift::TConnectionInfo& connInfo) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_d8);
  piVar2 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  poVar4 = this->f_out_;
  indent_abi_cxx11_(&sStack_d8,this);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_d8);
  poVar4 = std::operator<<(poVar4,"::apache::thrift::ReleaseHandler< ");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4," > cleanup(handlerFactory_);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_90,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr< ");
  poVar4 = std::operator<<(poVar4,local_b8);
  poVar4 = std::operator<<(poVar4," > handler(");
  poVar4 = std::operator<<(poVar4,"handlerFactory_->getHandler(connInfo), cleanup);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_b0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_b0);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr< ::apache::thrift::");
  bVar3 = std::operator==(__lhs,"Cob");
  if (bVar3) {
    pcVar6 = "async::TAsyncProcessor";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," > ");
  poVar4 = std::operator<<(poVar4,"processor(new ");
  poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
  poVar4 = std::operator<<(poVar4,(string *)&this->template_suffix_);
  poVar4 = std::operator<<(poVar4,"(handler));");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_50,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"return processor;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&sStack_d8);
  piVar2 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar4 = this->f_out_;
  indent_abi_cxx11_(&sStack_d8,this);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_d8);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ProcessorGenerator::generate_factory() {
  string if_factory_name = if_name_ + "Factory";

  // Generate the factory class definition
  f_header_ << template_header_ << "class " << factory_class_name_ << " : public ::apache::thrift::"
            << (style_ == "Cob" ? "async::TAsyncProcessorFactory" : "TProcessorFactory") << " {"
            << endl << " public:" << endl;
  indent_up();

  f_header_ << indent() << factory_class_name_ << "(const ::std::shared_ptr< " << if_factory_name
            << " >& handlerFactory) noexcept :" << endl << indent()
            << "    handlerFactory_(handlerFactory) {}" << endl << endl << indent()
            << "::std::shared_ptr< ::apache::thrift::"
            << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
            << "getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) override;"
            << endl;

  f_header_ << endl << " protected:" << endl << indent() << "::std::shared_ptr< "
            << if_factory_name << " > handlerFactory_;" << endl;

  indent_down();
  f_header_ << "};" << endl << endl;

  // If we are generating templates, output a typedef for the plain
  // factory name.
  if (generator_->gen_templates_) {
    f_header_ << "typedef " << factory_class_name_
              << "< ::apache::thrift::protocol::TDummyProtocol > " << service_name_ << pstyle_
              << "ProcessorFactory;" << endl << endl;
  }

  // Generate the getProcessor() method
  f_out_ << template_header_ << indent() << "::std::shared_ptr< ::apache::thrift::"
         << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
         << factory_class_name_ << template_suffix_ << "::getProcessor("
         << "const ::apache::thrift::TConnectionInfo& connInfo) {" << endl;
  indent_up();

  f_out_ << indent() << "::apache::thrift::ReleaseHandler< " << if_factory_name
         << " > cleanup(handlerFactory_);" << endl << indent() << "::std::shared_ptr< "
         << if_name_ << " > handler("
         << "handlerFactory_->getHandler(connInfo), cleanup);" << endl << indent()
         << "::std::shared_ptr< ::apache::thrift::"
         << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
         << "processor(new " << class_name_ << template_suffix_ << "(handler));" << endl << indent()
         << "return processor;" << endl;

  indent_down();
  f_out_ << indent() << "}" << endl << endl;
}